

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  LodePNGColorType LVar1;
  uint extraout_EAX;
  size_t sVar2;
  size_t sVar3;
  long lStack_50;
  ucvector tRNS;
  
  tRNS.allocsize = 0;
  tRNS.data = (uchar *)0x0;
  tRNS.size = 0;
  LVar1 = info->colortype;
  if (LVar1 == LCT_GREY) {
    if (info->key_defined == 0) goto LAB_0032b5e2;
    lStack_50 = 0x1c;
  }
  else {
    if (LVar1 != LCT_RGB) {
      if (LVar1 == LCT_PALETTE) {
        sVar3 = info->palettesize;
        do {
          sVar2 = sVar3;
          if (sVar2 == 0) break;
          sVar3 = sVar2 - 1;
        } while (info->palette[(sVar2 - 1) * 4 + 3] == 0xff);
        for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
          ucvector_push_back(&tRNS,info->palette[sVar3 * 4 + 3]);
        }
      }
      goto LAB_0032b5e2;
    }
    if (info->key_defined == 0) goto LAB_0032b5e2;
    ucvector_push_back(&tRNS,*(uchar *)((long)&info->key_r + 1));
    ucvector_push_back(&tRNS,(uchar)info->key_r);
    ucvector_push_back(&tRNS,*(uchar *)((long)&info->key_g + 1));
    ucvector_push_back(&tRNS,(uchar)info->key_g);
    lStack_50 = 0x24;
  }
  ucvector_push_back(&tRNS,*(uchar *)((long)&info->colortype + lStack_50 + 1));
  ucvector_push_back(&tRNS,*(uchar *)((long)&info->colortype + lStack_50));
LAB_0032b5e2:
  addChunk(out,"tRNS",tRNS.data,tRNS.size);
  ucvector_cleanup(&tRNS);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector tRNS;
  ucvector_init(&tRNS);
  if(info->colortype == LCT_PALETTE)
  {
    size_t amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i != 0; --i)
    {
      if(info->palette[4 * (i - 1) + 3] == 255) --amount;
      else break;
    }
    /*add only alpha channel*/
    for(i = 0; i != amount; ++i) ucvector_push_back(&tRNS, info->palette[4 * i + 3]);
  }
  else if(info->colortype == LCT_GREY)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r & 255));
    }
  }
  else if(info->colortype == LCT_RGB)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r & 255));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g & 255));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b & 255));
    }
  }

  error = addChunk(out, "tRNS", tRNS.data, tRNS.size);
  ucvector_cleanup(&tRNS);

  return error;
}